

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O1

ElementsDecodeRawTransactionRequestStruct * __thiscall
cfd::api::json::ElementsDecodeRawTransactionRequest::ConvertToStruct
          (ElementsDecodeRawTransactionRequestStruct *__return_storage_ptr__,
          ElementsDecodeRawTransactionRequest *this)

{
  _Rb_tree_header *p_Var1;
  
  (__return_storage_ptr__->hex)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->hex).field_2;
  (__return_storage_ptr__->hex)._M_string_length = 0;
  (__return_storage_ptr__->hex).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->network)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->network).field_2;
  (__return_storage_ptr__->network).field_2._M_allocated_capacity = 0x317664697571696c;
  (__return_storage_ptr__->network)._M_string_length = 8;
  (__return_storage_ptr__->network).field_2._M_local_buf[8] = '\0';
  (__return_storage_ptr__->mainchain_network)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mainchain_network).field_2;
  (__return_storage_ptr__->mainchain_network)._M_string_length = 0;
  (__return_storage_ptr__->mainchain_network).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->iswitness = true;
  __return_storage_ptr__->full_dump = false;
  p_Var1 = &(__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->network);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->mainchain_network);
  __return_storage_ptr__->iswitness = this->iswitness_;
  __return_storage_ptr__->full_dump = this->full_dump_;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(__return_storage_ptr__->ignore_items)._M_t,&(this->ignore_items)._M_t);
  return __return_storage_ptr__;
}

Assistant:

ElementsDecodeRawTransactionRequestStruct ElementsDecodeRawTransactionRequest::ConvertToStruct() const {  // NOLINT
  ElementsDecodeRawTransactionRequestStruct result;
  result.hex = hex_;
  result.network = network_;
  result.mainchain_network = mainchain_network_;
  result.iswitness = iswitness_;
  result.full_dump = full_dump_;
  result.ignore_items = ignore_items;
  return result;
}